

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  RepeatedPtrFieldBase *this_00;
  int iVar1;
  LogMessage *pLVar2;
  MessageLite *value;
  long *plVar3;
  long lVar4;
  LogFinisher local_61;
  LogMessage local_60;
  undefined4 extraout_var;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"AddMessage",CPPTYPE_MESSAGE);
  }
  if (factory == (MessageFactory *)0x0) {
    factory = this->message_factory_;
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar1 = this->extensions_offset_;
    if (iVar1 == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      pLVar2 = LogMessage::operator<<(&local_60,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_61,pLVar2);
      LogMessage::~LogMessage(&local_60);
      iVar1 = this->extensions_offset_;
    }
    value = ExtensionSet::AddMessage
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar1),field,
                       factory);
  }
  else {
    lVar4 = (long)this->offsets_
                  [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                   -0x11111111];
    this_00 = (RepeatedPtrFieldBase *)
              ((long)&(message->super_MessageLite)._vptr_MessageLite + lVar4);
    iVar1 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar4);
    if (iVar1 < *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar4 + 4)) {
      lVar4 = (long)iVar1;
      iVar1 = iVar1 + 1;
      this_00->current_size_ = iVar1;
      if ((Message *)this_00->elements_[lVar4] != (Message *)0x0) {
        return (Message *)this_00->elements_[lVar4];
      }
    }
    if (iVar1 == 0) {
      iVar1 = (*factory->_vptr_MessageFactory[2])(factory,*(undefined8 *)(field + 0x48));
      plVar3 = (long *)CONCAT44(extraout_var,iVar1);
    }
    else {
      if (iVar1 < 1) {
        LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar2 = LogMessage::operator<<(&local_60,"CHECK failed: (index) < (size()): ");
        LogFinisher::operator=(&local_61,pLVar2);
        LogMessage::~LogMessage(&local_60);
      }
      plVar3 = (long *)*this_00->elements_;
    }
    value = (MessageLite *)(**(code **)(*plVar3 + 0x18))();
    RepeatedPtrFieldBase::
    AddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              (this_00,(Type *)value);
  }
  return (Message *)value;
}

Assistant:

Message* GeneratedMessageReflection::AddMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(AddMessage, REPEATED, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->AddMessage(field, factory));
  } else {
    // We can't use AddField<Message>() because RepeatedPtrFieldBase doesn't
    // know how to allocate one.
    RepeatedPtrFieldBase* repeated =
        MutableRaw<RepeatedPtrFieldBase>(message, field);
    Message* result = repeated->AddFromCleared<GenericTypeHandler<Message> >();
    if (result == NULL) {
      // We must allocate a new object.
      const Message* prototype;
      if (repeated->size() == 0) {
        prototype = factory->GetPrototype(field->message_type());
      } else {
        prototype = &repeated->Get<GenericTypeHandler<Message> >(0);
      }
      result = prototype->New();
      repeated->AddAllocated<GenericTypeHandler<Message> >(result);
    }
    return result;
  }
}